

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::pressure<Fad<Fad<double>>>
          (TStokesAnalytic *this,TPZVec<Fad<Fad<double>_>_> *x,FADFADSTATE *p)

{
  byte bVar1;
  byte bVar2;
  Fad<Fad<double>_> *pFVar3;
  Fad<Fad<double>_> *copy;
  Fad<Fad<double>_> *pFVar4;
  TPZVec<Fad<Fad<double>_>_> *in_RSI;
  int64_t in_RDI;
  Fad<Fad<double>_> *v;
  double dVar5;
  FADFADSTATE fadRa;
  REAL lambda;
  REAL Re;
  TPZVec<Fad<Fad<double>_>_> flux;
  FADFADSTATE x3;
  FADFADSTATE x2;
  FADFADSTATE x1;
  Fad<Fad<double>_> *in_stack_ffffffffffffe588;
  Fad<Fad<double>_> *in_stack_ffffffffffffe590;
  Fad<Fad<double>_> *in_stack_ffffffffffffe598;
  Fad<Fad<double>_> *in_stack_ffffffffffffe5a8;
  Fad<Fad<double>_> *in_stack_ffffffffffffe5b0;
  Fad<Fad<double>_> *in_stack_ffffffffffffe5c0;
  Fad<Fad<double>_> *in_stack_ffffffffffffe5c8;
  Fad<Fad<double>_> *in_stack_ffffffffffffe5d0;
  double in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5e0;
  undefined1 in_stack_ffffffffffffe5e4;
  undefined1 in_stack_ffffffffffffe5e5;
  undefined1 in_stack_ffffffffffffe5e6;
  undefined1 in_stack_ffffffffffffe5e7;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *in_stack_ffffffffffffe638;
  Fad<Fad<double>_> *in_stack_ffffffffffffe640;
  FADFADSTATE *in_stack_ffffffffffffe648;
  FADFADSTATE *in_stack_ffffffffffffe698;
  Fad<Fad<double>_> *in_stack_ffffffffffffe6a0;
  FADFADSTATE *in_stack_ffffffffffffe6a8;
  size_t in_stack_ffffffffffffe9a8;
  char *in_stack_ffffffffffffe9b0;
  TPZVec<Fad<Fad<double>_>_> local_150 [10];
  TPZVec<Fad<Fad<double>_>_> *local_10;
  
  local_10 = in_RSI;
  TPZVec<Fad<Fad<double>_>_>::operator[](in_RSI,0);
  Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  pFVar3 = TPZVec<Fad<Fad<double>_>_>::operator[](local_10,1);
  Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  copy = TPZVec<Fad<Fad<double>_>_>::operator[](local_10,2);
  Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  Fad<Fad<double>_>::Fad<double,_nullptr>
            (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
  TPZVec<Fad<Fad<double>_>_>::TPZVec((TPZVec<Fad<Fad<double>_>_> *)pFVar3,in_RDI,copy);
  Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
  Fad<Fad<double>_>::Fad<double,_nullptr>
            (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
  pFVar3 = (Fad<Fad<double>_> *)(ulong)(*(int *)(in_RDI + 0x14) - 2);
  switch(pFVar3) {
  case (Fad<Fad<double>_> *)0x0:
    dVar5 = 1.0 / *(double *)(in_RDI + 0x18);
    pFVar4 = (Fad<Fad<double>_> *)(dVar5 * 0.5);
    sqrt(*(double *)(in_RDI + 0x28) * 4.0 * *(double *)(in_RDI + 0x28) + dVar5 * dVar5 * 0.25);
    operator*<double,_Fad<Fad<double>_>,_nullptr>(in_stack_ffffffffffffe5d8,pFVar4);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADexp(in_stack_ffffffffffffe648);
    operator*<double,_Fad<Fad<double>_>,_nullptr>(in_stack_ffffffffffffe5d8,pFVar4);
    Fad<Fad<double>>::operator=(in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0x1:
    dVar5 = 1.0 / *(double *)(in_RDI + 0x18);
    v = (Fad<Fad<double>_> *)(dVar5 * 0.5);
    sqrt(*(double *)(in_RDI + 0x28) * 4.0 * *(double *)(in_RDI + 0x28) + dVar5 * dVar5 * 0.25);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADexp(in_stack_ffffffffffffe648);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADcos(in_stack_ffffffffffffe6a8);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>(v,in_stack_ffffffffffffe5c0);
    operator-<double,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe5d0);
    pFVar4 = TPZVec<Fad<Fad<double>_>_>::operator[](local_150,0);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADexp(in_stack_ffffffffffffe648);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADsin(in_stack_ffffffffffffe698);
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)v,pFVar4);
    in_stack_ffffffffffffe5b0 = TPZVec<Fad<Fad<double>_>_>::operator[](local_150,1);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADexp(in_stack_ffffffffffffe648);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::operator=(in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    TPZVec<Fad<Fad<double>_>_>::operator[](local_150,0);
    TPZVec<Fad<Fad<double>_>_>::operator[](local_150,0);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>(v,pFVar4);
    TPZVec<Fad<Fad<double>_>_>::operator[](local_150,1);
    in_stack_ffffffffffffe590 = TPZVec<Fad<Fad<double>_>_>::operator[](local_150,1);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>(v,pFVar4);
    operator+<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)v,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)pFVar4);
    operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::operator+=
              (in_stack_ffffffffffffe6a0,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe698);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0x2:
  case (Fad<Fad<double>_> *)0x8:
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADcos(in_stack_ffffffffffffe6a8);
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADsin(in_stack_ffffffffffffe698);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0x3:
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator*<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator/<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)pFVar3,
               (double)CONCAT17(in_stack_ffffffffffffe5e7,
                                CONCAT16(in_stack_ffffffffffffe5e6,
                                         CONCAT15(in_stack_ffffffffffffe5e5,
                                                  CONCAT14(in_stack_ffffffffffffe5e4,
                                                           in_stack_ffffffffffffe5e0)))));
    operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe5c8,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffe5c0);
    operator+<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
                *)pFVar3,
               (double)CONCAT17(in_stack_ffffffffffffe5e7,
                                CONCAT16(in_stack_ffffffffffffe5e6,
                                         CONCAT15(in_stack_ffffffffffffe5e5,
                                                  CONCAT14(in_stack_ffffffffffffe5e4,
                                                           in_stack_ffffffffffffe5e0)))));
    operator*<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffe5c0);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0x4:
  case (Fad<Fad<double>_> *)0x9:
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADcos(in_stack_ffffffffffffe6a8);
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADsin(in_stack_ffffffffffffe698);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADcos(in_stack_ffffffffffffe6a8);
    Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    FADsin(in_stack_ffffffffffffe698);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator+<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe5c8,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe5c0);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe638);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0x5:
    Fad<Fad<double>_>::operator=<int,_nullptr>
              (in_stack_ffffffffffffe5d0,(int *)in_stack_ffffffffffffe5c8);
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
    break;
  case (Fad<Fad<double>_> *)0xa:
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADsin(in_stack_ffffffffffffe698);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADsin(in_stack_ffffffffffffe698);
    operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    operator*<double,_Fad<Fad<double>_>,_nullptr>
              (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
    FADsin(in_stack_ffffffffffffe698);
    operator*<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
    Fad<Fad<double>>::operator=
              (in_stack_ffffffffffffe640,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe638);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
               in_stack_ffffffffffffe590);
    break;
  case (Fad<Fad<double>_> *)0xb:
    Fad<Fad<double>_>::Fad<double,_nullptr>
              (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
    bVar1 = ::operator<(in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    if ((bVar1 & 1) == 0) {
      Fad<Fad<double>_>::Fad<double,_nullptr>
                (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
      bVar1 = operator>=(in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      if ((bVar1 & 1) != 0) {
        Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
        FADsin(in_stack_ffffffffffffe698);
        Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
        FADsin(in_stack_ffffffffffffe698);
        operator*<Fad<Fad<double>_>,_Fad<Fad<double>_>,_nullptr>
                  (in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
        Fad<Fad<double>>::operator=
                  (in_stack_ffffffffffffe640,
                   (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe638);
        FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      }
    }
    else {
      Fad<Fad<double>_>::operator-(in_stack_ffffffffffffe598);
      Fad<Fad<double>>::Fad<FadUnaryMin<Fad<Fad<double>>>>
                (copy,(FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)pFVar3);
      FADexp(in_stack_ffffffffffffe648);
      Fad<Fad<double>_>::operator-(in_stack_ffffffffffffe598);
      Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
      FADexp(in_stack_ffffffffffffe648);
      operator+<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
                ((FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)in_stack_ffffffffffffe5c8,
                 in_stack_ffffffffffffe5c0);
      Fad<Fad<double>_>::Fad(in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
      FADsin(in_stack_ffffffffffffe698);
      operator*<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
                ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      Fad<Fad<double>>::operator=
                (in_stack_ffffffffffffe640,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe638);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>::
      ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)0x1e69bb6);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)0x1e69bdd);
    }
    break;
  case (Fad<Fad<double>_> *)0xc:
    Fad<Fad<double>_>::Fad<double,_nullptr>
              (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
    bVar1 = ::operator<(in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
    Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
    if ((bVar1 & 1) == 0) {
      Fad<Fad<double>_>::Fad<double,_nullptr>
                (in_stack_ffffffffffffe5b0,(double *)in_stack_ffffffffffffe5a8);
      bVar2 = operator>=(in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      if ((bVar2 & 1) != 0) {
        dVar5 = *(double *)(in_RDI + 0x28) * 0.25;
        operator*<double,_Fad<Fad<double>_>,_nullptr>(dVar5,in_stack_ffffffffffffe5d0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3,
                   (double)CONCAT17(in_stack_ffffffffffffe5e7,
                                    CONCAT16(in_stack_ffffffffffffe5e6,
                                             CONCAT15(bVar1,CONCAT14(bVar2,in_stack_ffffffffffffe5e0
                                                                    )))));
        Fad<Fad<double>>::
        Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                  (copy,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                         *)pFVar3);
        FADcos(in_stack_ffffffffffffe6a8);
        operator*<double,_Fad<Fad<double>_>,_nullptr>(dVar5,in_stack_ffffffffffffe5d0);
        operator-<Fad<Fad<double>_>,_double,_nullptr>
                  (pFVar3,(double)CONCAT17(in_stack_ffffffffffffe5e7,
                                           CONCAT16(in_stack_ffffffffffffe5e6,
                                                    CONCAT15(bVar1,CONCAT14(bVar2,
                                                  in_stack_ffffffffffffe5e0)))));
        operator*<double,_Fad<Fad<double>_>,_nullptr>(dVar5,in_stack_ffffffffffffe5d0);
        Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
                  (copy,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
        FADcos(in_stack_ffffffffffffe6a8);
        operator-<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>,_nullptr>
                  ((FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)
                   in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
        operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe5c8,
                   (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
                    *)in_stack_ffffffffffffe5c0);
        operator-<Fad<Fad<double>_>,_double,_nullptr>
                  (pFVar3,(double)CONCAT17(in_stack_ffffffffffffe5e7,
                                           CONCAT16(in_stack_ffffffffffffe5e6,
                                                    CONCAT15(bVar1,CONCAT14(bVar2,
                                                  in_stack_ffffffffffffe5e0)))));
        Fad<Fad<double>>::Fad<FadBinaryMinus<Fad<Fad<double>>,FadCst<double>>>
                  (copy,(FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)pFVar3);
        FADsin(in_stack_ffffffffffffe698);
        operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>
                    *)in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
        Fad<Fad<double>>::operator=
                  (in_stack_ffffffffffffe640,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
                    *)in_stack_ffffffffffffe638);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
                    *)in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)
                   in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>
                    *)in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
                    *)in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)
                   in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe590);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                   in_stack_ffffffffffffe590);
      }
    }
    else {
      operator*<double,_Fad<Fad<double>_>,_nullptr>
                (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
      operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3,
                 (double)CONCAT17(in_stack_ffffffffffffe5e7,
                                  CONCAT16(in_stack_ffffffffffffe5e6,
                                           CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffe5e4,
                                                                   in_stack_ffffffffffffe5e0)))));
      ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                   *)in_stack_ffffffffffffe598);
      operator*<double,_Fad<Fad<double>_>,_nullptr>
                (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
      operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3,
                 (double)CONCAT17(in_stack_ffffffffffffe5e7,
                                  CONCAT16(in_stack_ffffffffffffe5e6,
                                           CONCAT15(bVar1,CONCAT14(in_stack_ffffffffffffe5e4,
                                                                   in_stack_ffffffffffffe5e0)))));
      Fad<Fad<double>>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                (copy,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                       *)pFVar3);
      FADcos(in_stack_ffffffffffffe6a8);
      operator*<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>,_nullptr>
                ((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                  *)in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      operator-<double,_Fad<Fad<double>_>,_nullptr>
                (in_stack_ffffffffffffe5d8,in_stack_ffffffffffffe5d0);
      Fad<Fad<double>>::Fad<FadBinaryMinus<FadCst<double>,Fad<Fad<double>>>>
                (copy,(FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)pFVar3);
      FADsin(in_stack_ffffffffffffe698);
      operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe5c8,in_stack_ffffffffffffe5c0);
      Fad<Fad<double>>::operator=
                (in_stack_ffffffffffffe640,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe638);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                 in_stack_ffffffffffffe590);
      FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
      ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffe590);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                 in_stack_ffffffffffffe590);
      FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                  *)0x1e6a1d4);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
      ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffe590);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)
                 in_stack_ffffffffffffe590);
    }
  }
  Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
  TPZVec<Fad<Fad<double>_>_>::~TPZVec((TPZVec<Fad<Fad<double>_>_> *)in_stack_ffffffffffffe5b0);
  Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
  Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
  Fad<Fad<double>_>::~Fad(in_stack_ffffffffffffe590);
  return;
}

Assistant:

void TStokesAnalytic::pressure(const TPZVec<FADFADSTATE > &x, FADFADSTATE &p) const
{
    FADFADSTATE x1 = x[0];
    FADFADSTATE x2 = x[1];
    FADFADSTATE x3 = x[2];
    TPZVec<FADFADSTATE > flux(3,0.);
    REAL Re = 0.;
    REAL lambda = 0.;
    FADFADSTATE fadRa = multRa;    

    switch(fExactSol)
    {
        case ESinCos:
        case ESinCosBDS:
            p = FADcos(x1)*FADsin(x2);
            break;
        case ENoFlow:
            p = (FADFADSTATE) fadRa*(x2*x2*x2-(x2*x2)/2.+x2-7./12.);
            break;
	case ECouplingSD:
	    if(x2< (FADFADSTATE) 0.){
		p = (-FADexp(-x2)+FADexp(x2))*FADsin(x1);		
	    }else if(x2>= (FADFADSTATE) 0.){
		p = FADsin(x1)*FADsin(x2);
	    }
	    break;
	case ECouplingNSD:
	    if(x2< (FADFADSTATE)1.){
		p = -(Pi*x2/4.)*FADcos(Pi*x1/2.)*FADsin(1.-x2);		
	    }else if(x2>= (FADFADSTATE)1.){
                p = (Pi/4.)*FADcos(Pi*x1/2.)*(x2-1.-FADcos(Pi*x2))*FADsin(x2-1.);
	    }
	    break;
        case ESinCos3D:
        case ESinCosBDS3D:
            p = FADcos(x1)*FADsin(x2)+FADcos(x2)*FADsin(x3);
            break;
        case EGatica3D:
            p = FADsin(Pi*x1)*FADsin(Pi*x2)*FADsin(Pi*x3);
            break;
        case EKovasznay:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            p = -(1./2.)*FADexp(2.*lambda*x1);
            break;
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - FADexp(lambda*x1)*FADcos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*FADexp(lambda*x1)*FADsin(2.*Pi*x2);
            p = -(1./2.)*FADexp(2.*lambda*x1);
            p += (1./2.)*(flux[0]*flux[0]+flux[1]*flux[1]);
            break;
        case EPconst:
            p = 0;
            break;
        default:
            DebugStop();
    }
    
}